

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_empty.c
# Opt level: O2

void test_write_format_tar_empty(void)

{
  int iVar1;
  uint uVar2;
  archive *paVar3;
  size_t used;
  char buff [2048];
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'(',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L')',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'*',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'+',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",paVar3)
  ;
  iVar1 = archive_write_set_bytes_in_last_block(paVar3,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L',',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 512)",
                   paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,0x800,&used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'-',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'3',(uint)(CONCAT44(used._4_4_,(int)used) == 0x400),"used == 1024",(void *)0x0)
  ;
  for (uVar2 = 0; (ulong)uVar2 < CONCAT44(used._4_4_,(int)used); uVar2 = uVar2 + 1) {
    failure("Empty tar archive should be all nulls.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                     ,L'6',(uint)(buff[uVar2] == '\0'),"buff[i] == 0",(void *)0x0);
  }
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L':',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L';',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'<',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'=',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",paVar3)
  ;
  iVar1 = archive_write_set_bytes_in_last_block(paVar3,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 512)",
                   paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,0x800,&used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'?',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'E',(long)(int)used,"(int)used",0x400,"1024",(void *)0x0);
  for (uVar2 = 0; (ulong)uVar2 < CONCAT44(used._4_4_,(int)used); uVar2 = uVar2 + 1) {
    failure("Empty tar archive should be all nulls.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                     ,L'H',(uint)(buff[uVar2] == '\0'),"buff[i] == 0",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_empty)
{
	struct archive *a;
	char buff[2048];
	size_t used;
	unsigned int i;

	/* USTAR format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert(used == 1024);
	for (i = 0; i < used; i++) {
		failure("Empty tar archive should be all nulls.");
		assert(buff[i] == 0);
	}

	/* PAX format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assertEqualInt((int)used, 1024);
	for (i = 0; i < used; i++) {
		failure("Empty tar archive should be all nulls.");
		assert(buff[i] == 0);
	}
}